

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall re2::CharClass::Contains(CharClass *this,Rune r)

{
  int iVar1;
  int local_2c;
  int m;
  int n;
  RuneRange *rr;
  Rune r_local;
  CharClass *this_local;
  
  _m = *(long *)(this + 8);
  local_2c = *(int *)(this + 0x10);
  do {
    while( true ) {
      if (local_2c < 1) {
        return false;
      }
      iVar1 = local_2c / 2;
      if (r <= *(int *)(_m + 4 + (long)iVar1 * 8)) break;
      _m = _m + (long)(iVar1 + 1) * 8;
      local_2c = local_2c - (iVar1 + 1);
    }
    local_2c = iVar1;
  } while (r < *(int *)(_m + (long)iVar1 * 8));
  return true;
}

Assistant:

bool CharClass::Contains(Rune r) {
  RuneRange* rr = ranges_;
  int n = nranges_;
  while (n > 0) {
    int m = n/2;
    if (rr[m].hi < r) {
      rr += m+1;
      n -= m+1;
    } else if (r < rr[m].lo) {
      n = m;
    } else {  // rr[m].lo <= r && r <= rr[m].hi
      return true;
    }
  }
  return false;
}